

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robber.cpp
# Opt level: O2

bool __thiscall Robber::canStayWith(Robber *this,Container *c)

{
  _List_node_base *__s1;
  _List_node_base *__s2;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  size_t sVar5;
  ostream *poVar6;
  byte bVar7;
  pointer_____offset_0x10___ *ppuVar8;
  Container *this_00;
  
  ppuVar8 = (pointer_____offset_0x10___ *)c;
  cVar3 = Container::begin(c);
  this_00 = c;
  cVar4 = Container::end(c);
  bVar7 = 0;
  while( true ) {
    if (cVar3._M_node == cVar4._M_node) {
      sVar5 = Container::size(c);
      if (sVar5 >= 2 && bVar7 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "Voleur seul avec la famille sans le policier");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      return (bool)(sVar5 < 2 | bVar7);
    }
    if (cVar3._M_node[1]._M_next == (_List_node_base *)0x0) break;
    this_00 = (Container *)(cVar3._M_node[1]._M_next)->_M_next[-1]._M_prev;
    ppuVar8 = &Policeman::typeinfo;
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)&Policeman::typeinfo);
    bVar7 = bVar7 | bVar1;
    cVar3._M_node = (cVar3._M_node)->_M_next;
  }
  __cxa_bad_typeid();
  __s1 = (_List_node_base *)(this_00->name)._M_dataplus._M_p;
  __s2 = (_List_node_base *)(((Container *)ppuVar8)->name)._M_dataplus._M_p;
  if (__s1 != __s2) {
    if (*(char *)&__s1->_M_next == '*') {
      return false;
    }
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool Robber::canStayWith(const Container &c) const {
    bool isPolicemanHere = false;

    // Iterates through the list of Person
    for (Person* p : c){
        if(typeid(*p) == typeid(Policeman)) isPolicemanHere = true;
    }

    // If there is no policeman, cannot be with other members
    if(c.size() > 1 && !isPolicemanHere) {
        std::cout << "Voleur seul avec la famille sans le policier" << std::endl;
        return false;
    }
    return true;
}